

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O2

Slice __thiscall leveldb::FilterBlockBuilder::Finish(FilterBlockBuilder *this)

{
  string *dst;
  long lVar1;
  size_type sVar2;
  pointer puVar3;
  size_t i;
  ulong uVar4;
  long in_FS_OFFSET;
  Slice SVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    GenerateFilter(this);
  }
  dst = &this->result_;
  sVar2 = (this->result_)._M_string_length;
  for (uVar4 = 0;
      puVar3 = (this->filter_offsets_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->filter_offsets_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar3 >> 2);
      uVar4 = uVar4 + 1) {
    PutFixed32(dst,puVar3[uVar4]);
  }
  PutFixed32(dst,(uint32_t)sVar2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (dst,'\v');
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar5.data_ = (this->result_)._M_dataplus._M_p;
    SVar5.size_ = (this->result_)._M_string_length;
    return SVar5;
  }
  __stack_chk_fail();
}

Assistant:

Slice FilterBlockBuilder::Finish() {
  if (!start_.empty()) {
    GenerateFilter();
  }

  // Append array of per-filter offsets
  const uint32_t array_offset = result_.size();
  for (size_t i = 0; i < filter_offsets_.size(); i++) {
    PutFixed32(&result_, filter_offsets_[i]);
  }

  PutFixed32(&result_, array_offset);
  result_.push_back(kFilterBaseLg);  // Save encoding parameter in result
  return Slice(result_);
}